

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4.cpp
# Opt level: O0

uchar * body(md4_context *ctx,uchar *data,size_t size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  quint32 saved_d;
  quint32 saved_c;
  quint32 saved_b;
  quint32 saved_a;
  quint32 d;
  quint32 c;
  quint32 b;
  quint32 a;
  uchar *ptr;
  size_t size_local;
  uchar *data_local;
  md4_context *ctx_local;
  
  a = ctx->a;
  b = ctx->b;
  c = ctx->c;
  d = ctx->d;
  ptr = data;
  size_local = size;
  do {
    uVar1 = (d ^ b & (c ^ d)) + *(int *)ptr + a;
    uVar2 = uVar1 * 8 | uVar1 >> 0x1d;
    uVar1 = (c ^ uVar2 & (b ^ c)) + *(int *)(ptr + 4) + d;
    uVar3 = uVar1 * 0x80 | uVar1 >> 0x19;
    uVar1 = (b ^ uVar3 & (uVar2 ^ b)) + *(int *)(ptr + 8) + c;
    uVar4 = uVar1 * 0x800 | uVar1 >> 0x15;
    uVar1 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + *(int *)(ptr + 0xc) + b;
    uVar1 = uVar1 * 0x80000 | uVar1 >> 0xd;
    uVar2 = (uVar3 ^ uVar1 & (uVar4 ^ uVar3)) + *(int *)(ptr + 0x10) + uVar2;
    uVar2 = uVar2 * 8 | uVar2 >> 0x1d;
    uVar3 = (uVar4 ^ uVar2 & (uVar1 ^ uVar4)) + *(int *)(ptr + 0x14) + uVar3;
    uVar3 = uVar3 * 0x80 | uVar3 >> 0x19;
    uVar4 = (uVar1 ^ uVar3 & (uVar2 ^ uVar1)) + *(int *)(ptr + 0x18) + uVar4;
    uVar4 = uVar4 * 0x800 | uVar4 >> 0x15;
    uVar1 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + *(int *)(ptr + 0x1c) + uVar1;
    uVar1 = uVar1 * 0x80000 | uVar1 >> 0xd;
    uVar2 = (uVar3 ^ uVar1 & (uVar4 ^ uVar3)) + *(int *)(ptr + 0x20) + uVar2;
    uVar2 = uVar2 * 8 | uVar2 >> 0x1d;
    uVar3 = (uVar4 ^ uVar2 & (uVar1 ^ uVar4)) + *(int *)(ptr + 0x24) + uVar3;
    uVar3 = uVar3 * 0x80 | uVar3 >> 0x19;
    uVar4 = (uVar1 ^ uVar3 & (uVar2 ^ uVar1)) + *(int *)(ptr + 0x28) + uVar4;
    uVar4 = uVar4 * 0x800 | uVar4 >> 0x15;
    uVar1 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + *(int *)(ptr + 0x2c) + uVar1;
    uVar1 = uVar1 * 0x80000 | uVar1 >> 0xd;
    uVar2 = (uVar3 ^ uVar1 & (uVar4 ^ uVar3)) + *(int *)(ptr + 0x30) + uVar2;
    uVar2 = uVar2 * 8 | uVar2 >> 0x1d;
    uVar3 = (uVar4 ^ uVar2 & (uVar1 ^ uVar4)) + *(int *)(ptr + 0x34) + uVar3;
    uVar3 = uVar3 * 0x80 | uVar3 >> 0x19;
    uVar4 = (uVar1 ^ uVar3 & (uVar2 ^ uVar1)) + *(int *)(ptr + 0x38) + uVar4;
    uVar4 = uVar4 * 0x800 | uVar4 >> 0x15;
    uVar1 = (uVar2 ^ uVar4 & (uVar3 ^ uVar2)) + *(int *)(ptr + 0x3c) + uVar1;
    uVar1 = uVar1 * 0x80000 | uVar1 >> 0xd;
    uVar2 = (uVar1 & (uVar4 | uVar3) | uVar4 & uVar3) + *(int *)ptr + 0x5a827999 + uVar2;
    uVar2 = uVar2 * 8 | uVar2 >> 0x1d;
    uVar3 = (uVar2 & (uVar1 | uVar4) | uVar1 & uVar4) + *(int *)(ptr + 0x10) + 0x5a827999 + uVar3;
    uVar3 = uVar3 * 0x20 | uVar3 >> 0x1b;
    uVar4 = (uVar3 & (uVar2 | uVar1) | uVar2 & uVar1) + *(int *)(ptr + 0x20) + 0x5a827999 + uVar4;
    uVar4 = uVar4 * 0x200 | uVar4 >> 0x17;
    uVar1 = (uVar4 & (uVar3 | uVar2) | uVar3 & uVar2) + *(int *)(ptr + 0x30) + 0x5a827999 + uVar1;
    uVar1 = uVar1 * 0x2000 | uVar1 >> 0x13;
    uVar2 = (uVar1 & (uVar4 | uVar3) | uVar4 & uVar3) + *(int *)(ptr + 4) + 0x5a827999 + uVar2;
    uVar2 = uVar2 * 8 | uVar2 >> 0x1d;
    uVar3 = (uVar2 & (uVar1 | uVar4) | uVar1 & uVar4) + *(int *)(ptr + 0x14) + 0x5a827999 + uVar3;
    uVar3 = uVar3 * 0x20 | uVar3 >> 0x1b;
    uVar4 = (uVar3 & (uVar2 | uVar1) | uVar2 & uVar1) + *(int *)(ptr + 0x24) + 0x5a827999 + uVar4;
    uVar4 = uVar4 * 0x200 | uVar4 >> 0x17;
    uVar1 = (uVar4 & (uVar3 | uVar2) | uVar3 & uVar2) + *(int *)(ptr + 0x34) + 0x5a827999 + uVar1;
    uVar1 = uVar1 * 0x2000 | uVar1 >> 0x13;
    uVar2 = (uVar1 & (uVar4 | uVar3) | uVar4 & uVar3) + *(int *)(ptr + 8) + 0x5a827999 + uVar2;
    uVar2 = uVar2 * 8 | uVar2 >> 0x1d;
    uVar3 = (uVar2 & (uVar1 | uVar4) | uVar1 & uVar4) + *(int *)(ptr + 0x18) + 0x5a827999 + uVar3;
    uVar3 = uVar3 * 0x20 | uVar3 >> 0x1b;
    uVar4 = (uVar3 & (uVar2 | uVar1) | uVar2 & uVar1) + *(int *)(ptr + 0x28) + 0x5a827999 + uVar4;
    uVar4 = uVar4 * 0x200 | uVar4 >> 0x17;
    uVar1 = (uVar4 & (uVar3 | uVar2) | uVar3 & uVar2) + *(int *)(ptr + 0x38) + 0x5a827999 + uVar1;
    uVar1 = uVar1 * 0x2000 | uVar1 >> 0x13;
    uVar2 = (uVar1 & (uVar4 | uVar3) | uVar4 & uVar3) + *(int *)(ptr + 0xc) + 0x5a827999 + uVar2;
    uVar2 = uVar2 * 8 | uVar2 >> 0x1d;
    uVar3 = (uVar2 & (uVar1 | uVar4) | uVar1 & uVar4) + *(int *)(ptr + 0x1c) + 0x5a827999 + uVar3;
    uVar3 = uVar3 * 0x20 | uVar3 >> 0x1b;
    uVar4 = (uVar3 & (uVar2 | uVar1) | uVar2 & uVar1) + *(int *)(ptr + 0x2c) + 0x5a827999 + uVar4;
    uVar4 = uVar4 * 0x200 | uVar4 >> 0x17;
    uVar1 = (uVar4 & (uVar3 | uVar2) | uVar3 & uVar2) + *(int *)(ptr + 0x3c) + 0x5a827999 + uVar1;
    uVar1 = uVar1 * 0x2000 | uVar1 >> 0x13;
    uVar2 = (uVar1 ^ uVar4 ^ uVar3) + *(int *)ptr + 0x6ed9eba1 + uVar2;
    uVar2 = uVar2 * 8 | uVar2 >> 0x1d;
    uVar3 = (uVar2 ^ uVar1 ^ uVar4) + *(int *)(ptr + 0x20) + 0x6ed9eba1 + uVar3;
    uVar3 = uVar3 * 0x200 | uVar3 >> 0x17;
    uVar4 = (uVar3 ^ uVar2 ^ uVar1) + *(int *)(ptr + 0x10) + 0x6ed9eba1 + uVar4;
    uVar4 = uVar4 * 0x800 | uVar4 >> 0x15;
    uVar1 = (uVar4 ^ uVar3 ^ uVar2) + *(int *)(ptr + 0x30) + 0x6ed9eba1 + uVar1;
    uVar1 = uVar1 * 0x8000 | uVar1 >> 0x11;
    uVar2 = (uVar1 ^ uVar4 ^ uVar3) + *(int *)(ptr + 8) + 0x6ed9eba1 + uVar2;
    uVar2 = uVar2 * 8 | uVar2 >> 0x1d;
    uVar3 = (uVar2 ^ uVar1 ^ uVar4) + *(int *)(ptr + 0x28) + 0x6ed9eba1 + uVar3;
    uVar3 = uVar3 * 0x200 | uVar3 >> 0x17;
    uVar4 = (uVar3 ^ uVar2 ^ uVar1) + *(int *)(ptr + 0x18) + 0x6ed9eba1 + uVar4;
    uVar4 = uVar4 * 0x800 | uVar4 >> 0x15;
    uVar1 = (uVar4 ^ uVar3 ^ uVar2) + *(int *)(ptr + 0x38) + 0x6ed9eba1 + uVar1;
    uVar1 = uVar1 * 0x8000 | uVar1 >> 0x11;
    uVar2 = (uVar1 ^ uVar4 ^ uVar3) + *(int *)(ptr + 4) + 0x6ed9eba1 + uVar2;
    uVar2 = uVar2 * 8 | uVar2 >> 0x1d;
    uVar3 = (uVar2 ^ uVar1 ^ uVar4) + *(int *)(ptr + 0x24) + 0x6ed9eba1 + uVar3;
    uVar3 = uVar3 * 0x200 | uVar3 >> 0x17;
    uVar4 = (uVar3 ^ uVar2 ^ uVar1) + *(int *)(ptr + 0x14) + 0x6ed9eba1 + uVar4;
    uVar4 = uVar4 * 0x800 | uVar4 >> 0x15;
    uVar1 = (uVar4 ^ uVar3 ^ uVar2) + *(int *)(ptr + 0x34) + 0x6ed9eba1 + uVar1;
    uVar5 = uVar1 * 0x8000 | uVar1 >> 0x11;
    uVar2 = (uVar5 ^ uVar4 ^ uVar3) + *(int *)(ptr + 0xc) + 0x6ed9eba1 + uVar2;
    uVar1 = uVar2 * 8 | uVar2 >> 0x1d;
    uVar3 = (uVar1 ^ uVar5 ^ uVar4) + *(int *)(ptr + 0x2c) + 0x6ed9eba1 + uVar3;
    uVar2 = uVar3 * 0x200 | uVar3 >> 0x17;
    uVar4 = (uVar2 ^ uVar1 ^ uVar5) + *(int *)(ptr + 0x1c) + 0x6ed9eba1 + uVar4;
    uVar3 = uVar4 * 0x800 | uVar4 >> 0x15;
    uVar5 = (uVar3 ^ uVar2 ^ uVar1) + *(int *)(ptr + 0x3c) + 0x6ed9eba1 + uVar5;
    a = a + uVar1;
    b = b + (uVar5 * 0x8000 | uVar5 >> 0x11);
    c = c + uVar3;
    d = d + uVar2;
    ptr = ptr + 0x40;
    size_local = size_local - 0x40;
  } while (size_local != 0);
  ctx->a = a;
  ctx->b = b;
  ctx->c = c;
  ctx->d = d;
  return ptr;
}

Assistant:

static const unsigned char *body(struct md4_context *ctx, const unsigned char *data, size_t size)
{
	const unsigned char *ptr;
	quint32 a, b, c, d;
	quint32 saved_a, saved_b, saved_c, saved_d;

	ptr = data;

	a = ctx->a;
	b = ctx->b;
	c = ctx->c;
	d = ctx->d;

	do {
		saved_a = a;
		saved_b = b;
		saved_c = c;
		saved_d = d;

/* Round 1 */
		STEP(F, a, b, c, d, SET( 0),  3);
		STEP(F, d, a, b, c, SET( 1),  7);
		STEP(F, c, d, a, b, SET( 2), 11);
		STEP(F, b, c, d, a, SET( 3), 19);

		STEP(F, a, b, c, d, SET( 4),  3);
		STEP(F, d, a, b, c, SET( 5),  7);
		STEP(F, c, d, a, b, SET( 6), 11);
		STEP(F, b, c, d, a, SET( 7), 19);

		STEP(F, a, b, c, d, SET( 8),  3);
		STEP(F, d, a, b, c, SET( 9),  7);
		STEP(F, c, d, a, b, SET(10), 11);
		STEP(F, b, c, d, a, SET(11), 19);

		STEP(F, a, b, c, d, SET(12),  3);
		STEP(F, d, a, b, c, SET(13),  7);
		STEP(F, c, d, a, b, SET(14), 11);
		STEP(F, b, c, d, a, SET(15), 19);
/* Round 2 */
		STEP(G, a, b, c, d, GET( 0) + 0x5A827999,  3);
		STEP(G, d, a, b, c, GET( 4) + 0x5A827999,  5);
		STEP(G, c, d, a, b, GET( 8) + 0x5A827999,  9);
		STEP(G, b, c, d, a, GET(12) + 0x5A827999, 13);

		STEP(G, a, b, c, d, GET( 1) + 0x5A827999,  3);
		STEP(G, d, a, b, c, GET( 5) + 0x5A827999,  5);
		STEP(G, c, d, a, b, GET( 9) + 0x5A827999,  9);
		STEP(G, b, c, d, a, GET(13) + 0x5A827999, 13);

		STEP(G, a, b, c, d, GET( 2) + 0x5A827999,  3);
		STEP(G, d, a, b, c, GET( 6) + 0x5A827999,  5);
		STEP(G, c, d, a, b, GET(10) + 0x5A827999,  9);
		STEP(G, b, c, d, a, GET(14) + 0x5A827999, 13);

		STEP(G, a, b, c, d, GET( 3) + 0x5A827999,  3);
		STEP(G, d, a, b, c, GET( 7) + 0x5A827999,  5);
		STEP(G, c, d, a, b, GET(11) + 0x5A827999,  9);
		STEP(G, b, c, d, a, GET(15) + 0x5A827999, 13);
/* Round 3 */
		STEP(H, a, b, c, d, GET( 0) + 0x6ED9EBA1,  3);
		STEP(H, d, a, b, c, GET( 8) + 0x6ED9EBA1,  9);
		STEP(H, c, d, a, b, GET( 4) + 0x6ED9EBA1, 11);
		STEP(H, b, c, d, a, GET(12) + 0x6ED9EBA1, 15);

		STEP(H, a, b, c, d, GET( 2) + 0x6ED9EBA1,  3);
		STEP(H, d, a, b, c, GET(10) + 0x6ED9EBA1,  9);
		STEP(H, c, d, a, b, GET( 6) + 0x6ED9EBA1, 11);
		STEP(H, b, c, d, a, GET(14) + 0x6ED9EBA1, 15);

		STEP(H, a, b, c, d, GET( 1) + 0x6ED9EBA1,  3);
		STEP(H, d, a, b, c, GET( 9) + 0x6ED9EBA1,  9);
		STEP(H, c, d, a, b, GET( 5) + 0x6ED9EBA1, 11);
		STEP(H, b, c, d, a, GET(13) + 0x6ED9EBA1, 15);

		STEP(H, a, b, c, d, GET( 3) + 0x6ED9EBA1,  3);
		STEP(H, d, a, b, c, GET(11) + 0x6ED9EBA1,  9);
		STEP(H, c, d, a, b, GET( 7) + 0x6ED9EBA1, 11);
		STEP(H, b, c, d, a, GET(15) + 0x6ED9EBA1, 15);

		a += saved_a;
		b += saved_b;
		c += saved_c;
		d += saved_d;

		ptr += 64;
	} while (size -= 64);

	ctx->a = a;
	ctx->b = b;
	ctx->c = c;
	ctx->d = d;

	return ptr;
}